

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
* __thiscall
adios2::core::Engine::DoBlocksInfo
          (vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
           *__return_storage_ptr__,Engine *this,Variable<unsigned_char> *variable,size_t step)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DoBlocksInfo","");
  ThrowUp(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}